

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::GeomMesh>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GeomMesh *mesh,string *prop_name,Property *out_prop)

{
  bool bVar1;
  pointer_conflict ppVar2;
  ParseState *value;
  ParseState *value_00;
  ParseState *value_01;
  ParseState *value_02;
  ParseState *value_03;
  ParseState *value_04;
  ParseState *value_05;
  ParseState *value_06;
  ParseState *value_07;
  ParseState *value_08;
  ParseState *value_09;
  ParseState *value_10;
  ParseState *value_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_b9a;
  bool local_b99;
  _Self local_b98;
  _Self local_b90;
  const_iterator it;
  Property local_b80;
  value_type *local_5a0;
  Relationship *rel;
  string local_590 [32];
  string local_570;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  allocator local_529;
  string local_528 [32];
  string local_508;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  allocator local_4c1;
  string local_4c0 [32];
  string local_4a0;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  allocator local_459;
  string local_458 [32];
  string local_438;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_418;
  allocator local_3f1;
  string local_3f0 [32];
  string local_3d0;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  allocator local_389;
  string local_388 [32];
  string local_368;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  allocator local_321;
  string local_320 [32];
  string local_300;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  allocator local_251;
  string local_250 [32];
  string local_230;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  allocator local_181;
  string local_180 [32];
  string local_160;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  allocator local_119;
  string local_118 [32];
  string local_f8;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [32];
  string local_90;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_50 [8];
  string err;
  Property *out_prop_local;
  string *prop_name_local;
  GeomMesh *mesh_local;
  
  if (out_prop == (Property *)0x0) {
    err.field_2._8_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                   ((char (*) [59])"[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)((long)&err.field_2 + 8));
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)local_50);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            prop_name,"points");
  if (bVar1) {
    bVar1 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (&mesh->points,out_prop,(string *)local_50);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b0,"Convert Property {} failed: {}\n",&local_b1);
      fmt::format<char[7],std::__cxx11::string>
                (&local_90,(fmt *)local_b0,(string *)"points",(char (*) [7])local_50,in_R8);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                (&local_70,(expected_lite *)&local_90,value);
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,&local_70);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      goto LAB_00480f75;
    }
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              prop_name,"faceVertexCounts");
    if (bVar1) {
      bVar1 = (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                        (&mesh->faceVertexCounts,out_prop,(string *)local_50);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_118,"Convert Property {} failed: {}\n",&local_119);
        fmt::format<char[17],std::__cxx11::string>
                  (&local_f8,(fmt *)local_118,(string *)"faceVertexCounts",(char (*) [17])local_50,
                   in_R8);
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  (&local_d8,(expected_lite *)&local_f8,value_00);
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,&local_d8);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type(&local_d8);
        ::std::__cxx11::string::~string((string *)&local_f8);
        ::std::__cxx11::string::~string(local_118);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
        goto LAB_00480f75;
      }
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )prop_name,"faceVertexIndices");
      if (bVar1) {
        bVar1 = (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                          (&mesh->faceVertexCounts,out_prop,(string *)local_50);
        if (!bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_180,"Convert Property {} failed: {}\n",&local_181);
          fmt::format<char[18],std::__cxx11::string>
                    (&local_160,(fmt *)local_180,(string *)"faceVertexIndices",
                     (char (*) [18])local_50,in_R8);
          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                    (&local_140,(expected_lite *)&local_160,value_01);
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,&local_140);
          nonstd::expected_lite::
          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~unexpected_type(&local_140);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::__cxx11::string::~string(local_180);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
          goto LAB_00480f75;
        }
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)prop_name,"normals");
        if (bVar1) {
          bVar1 = (anonymous_namespace)::
                  ToProperty<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                            (&mesh->normals,out_prop,(string *)local_50);
          if (!bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_1e8,"Convert Property {} failed: {}\n",&local_1e9);
            fmt::format<char[8],std::__cxx11::string>
                      (&local_1c8,(fmt *)local_1e8,(string *)"normals",(char (*) [8])local_50,in_R8)
            ;
            nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                      (&local_1a8,(expected_lite *)&local_1c8,value_02);
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (__return_storage_ptr__,&local_1a8);
            nonstd::expected_lite::
            unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~unexpected_type(&local_1a8);
            ::std::__cxx11::string::~string((string *)&local_1c8);
            ::std::__cxx11::string::~string(local_1e8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            goto LAB_00480f75;
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)prop_name,"velocities");
          if (bVar1) {
            bVar1 = (anonymous_namespace)::
                    ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                              (&mesh->velocities,out_prop,(string *)local_50);
            if (!bVar1) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_250,"Convert Property {} failed: {}\n",&local_251);
              fmt::format<char[11],std::__cxx11::string>
                        (&local_230,(fmt *)local_250,(string *)"velocities",(char (*) [11])local_50,
                         in_R8);
              nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                        (&local_210,(expected_lite *)&local_230,value_03);
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (__return_storage_ptr__,&local_210);
              nonstd::expected_lite::
              unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~unexpected_type(&local_210);
              ::std::__cxx11::string::~string((string *)&local_230);
              ::std::__cxx11::string::~string(local_250);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
              goto LAB_00480f75;
            }
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)prop_name,"cornerIndices");
            if (bVar1) {
              bVar1 = (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                                (&mesh->cornerIndices,out_prop,(string *)local_50);
              if (!bVar1) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_2b8,"Convert Property {} failed: {}\n",&local_2b9);
                fmt::format<char[14],std::__cxx11::string>
                          (&local_298,(fmt *)local_2b8,(string *)"cornerIndices",
                           (char (*) [14])local_50,in_R8);
                nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                          (&local_278,(expected_lite *)&local_298,value_04);
                nonstd::expected_lite::
                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (__return_storage_ptr__,&local_278);
                nonstd::expected_lite::
                unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~unexpected_type(&local_278);
                ::std::__cxx11::string::~string((string *)&local_298);
                ::std::__cxx11::string::~string(local_2b8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
                goto LAB_00480f75;
              }
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)prop_name,"cornerSharpnesses");
              if (bVar1) {
                bVar1 = (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                                  (&mesh->cornerSharpnesses,out_prop,(string *)local_50);
                if (!bVar1) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_320,"Convert Property {} failed: {}\n",&local_321);
                  fmt::format<char[18],std::__cxx11::string>
                            (&local_300,(fmt *)local_320,(string *)"cornerSharpnesses",
                             (char (*) [18])local_50,in_R8);
                  nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                            (&local_2e0,(expected_lite *)&local_300,value_05);
                  nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (__return_storage_ptr__,&local_2e0);
                  nonstd::expected_lite::
                  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~unexpected_type(&local_2e0);
                  ::std::__cxx11::string::~string((string *)&local_300);
                  ::std::__cxx11::string::~string(local_320);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
                  goto LAB_00480f75;
                }
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)prop_name,"creaseIndices");
                if (bVar1) {
                  bVar1 = (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                                    (&mesh->creaseIndices,out_prop,(string *)local_50);
                  if (!bVar1) {
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_388,"Convert Property {} failed: {}\n",&local_389);
                    fmt::format<char[14],std::__cxx11::string>
                              (&local_368,(fmt *)local_388,(string *)"creaseIndices",
                               (char (*) [14])local_50,in_R8);
                    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                              (&local_348,(expected_lite *)&local_368,value_06);
                    nonstd::expected_lite::
                    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::
                    expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (__return_storage_ptr__,&local_348);
                    nonstd::expected_lite::
                    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~unexpected_type(&local_348);
                    ::std::__cxx11::string::~string((string *)&local_368);
                    ::std::__cxx11::string::~string(local_388);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
                    goto LAB_00480f75;
                  }
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)prop_name,"creaseSharpnesses");
                  if (bVar1) {
                    bVar1 = (anonymous_namespace)::
                            ToProperty<std::vector<float,std::allocator<float>>>
                                      (&mesh->creaseSharpnesses,out_prop,(string *)local_50);
                    if (!bVar1) {
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_3f0,"Convert Property {} failed: {}\n",&local_3f1);
                      fmt::format<char[18],std::__cxx11::string>
                                (&local_3d0,(fmt *)local_3f0,(string *)"creaseSharpnesses",
                                 (char (*) [18])local_50,in_R8);
                      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                (&local_3b0,(expected_lite *)&local_3d0,value_07);
                      nonstd::expected_lite::
                      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::
                      expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (__return_storage_ptr__,&local_3b0);
                      nonstd::expected_lite::
                      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~unexpected_type(&local_3b0);
                      ::std::__cxx11::string::~string((string *)&local_3d0);
                      ::std::__cxx11::string::~string(local_3f0);
                      ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
                      goto LAB_00480f75;
                    }
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)prop_name,"holeIndices");
                    if (bVar1) {
                      bVar1 = (anonymous_namespace)::
                              ToProperty<std::vector<int,std::allocator<int>>>
                                        (&mesh->holeIndices,out_prop,(string *)local_50);
                      if (!bVar1) {
                        ::std::allocator<char>::allocator();
                        ::std::__cxx11::string::string
                                  (local_458,"Convert Property {} failed: {}\n",&local_459);
                        fmt::format<char[12],std::__cxx11::string>
                                  (&local_438,(fmt *)local_458,(string *)"holeIndices",
                                   (char (*) [12])local_50,in_R8);
                        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                  (&local_418,(expected_lite *)&local_438,value_08);
                        nonstd::expected_lite::
                        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                  (__return_storage_ptr__,&local_418);
                        nonstd::expected_lite::
                        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~unexpected_type(&local_418);
                        ::std::__cxx11::string::~string((string *)&local_438);
                        ::std::__cxx11::string::~string(local_458);
                        ::std::allocator<char>::~allocator((allocator<char> *)&local_459);
                        goto LAB_00480f75;
                      }
                    }
                    else {
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)prop_name,"interpolateBoundary");
                      if (bVar1) {
                        bVar1 = ToTokenProperty<tinyusdz::GeomMesh::InterpolateBoundary>
                                          (&mesh->interpolateBoundary,out_prop,(string *)local_50);
                        if (!bVar1) {
                          ::std::allocator<char>::allocator();
                          ::std::__cxx11::string::string
                                    (local_4c0,"Convert Property {} failed: {}\n",&local_4c1);
                          fmt::format<char[20],std::__cxx11::string>
                                    (&local_4a0,(fmt *)local_4c0,(string *)"interpolateBoundary",
                                     (char (*) [20])local_50,in_R8);
                          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                    (&local_480,(expected_lite *)&local_4a0,value_09);
                          nonstd::expected_lite::
                          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::
                          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                    (__return_storage_ptr__,&local_480);
                          nonstd::expected_lite::
                          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~unexpected_type(&local_480);
                          ::std::__cxx11::string::~string((string *)&local_4a0);
                          ::std::__cxx11::string::~string(local_4c0);
                          ::std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
                          goto LAB_00480f75;
                        }
                      }
                      else {
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)prop_name,"subdivisionScheme");
                        if (bVar1) {
                          bVar1 = ToTokenProperty<tinyusdz::GeomMesh::SubdivisionScheme>
                                            (&mesh->subdivisionScheme,out_prop,(string *)local_50);
                          if (!bVar1) {
                            ::std::allocator<char>::allocator();
                            ::std::__cxx11::string::string
                                      (local_528,"Convert Property {} failed: {}\n",&local_529);
                            fmt::format<char[18],std::__cxx11::string>
                                      (&local_508,(fmt *)local_528,(string *)"subdivisionScheme",
                                       (char (*) [18])local_50,in_R8);
                            nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                      (&local_4e8,(expected_lite *)&local_508,value_10);
                            nonstd::expected_lite::
                            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::
                            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                      (__return_storage_ptr__,&local_4e8);
                            nonstd::expected_lite::
                            unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~unexpected_type(&local_4e8);
                            ::std::__cxx11::string::~string((string *)&local_508);
                            ::std::__cxx11::string::~string(local_528);
                            ::std::allocator<char>::~allocator((allocator<char> *)&local_529);
                            goto LAB_00480f75;
                          }
                        }
                        else {
                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)prop_name,"faceVaryingLinearInterpolation");
                          if (bVar1) {
                            bVar1 = ToTokenProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                              (&mesh->faceVaryingLinearInterpolation,out_prop,
                                               (string *)local_50);
                            if (!bVar1) {
                              ::std::allocator<char>::allocator();
                              ::std::__cxx11::string::string
                                        (local_590,"Convert Property {} failed: {}\n",
                                         (allocator *)((long)&rel + 7));
                              fmt::format<char[31],std::__cxx11::string>
                                        (&local_570,(fmt *)local_590,
                                         (string *)"faceVaryingLinearInterpolation",
                                         (char (*) [31])local_50,in_R8);
                              nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                                        (&local_550,(expected_lite *)&local_570,value_11);
                              nonstd::expected_lite::
                              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::
                              expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                        (__return_storage_ptr__,&local_550);
                              nonstd::expected_lite::
                              unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~unexpected_type(&local_550);
                              ::std::__cxx11::string::~string((string *)&local_570);
                              ::std::__cxx11::string::~string(local_590);
                              ::std::allocator<char>::~allocator
                                        ((allocator<char> *)((long)&rel + 7));
                              goto LAB_00480f75;
                            }
                          }
                          else {
                            bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)prop_name,"skeleton");
                            if (bVar1) {
                              bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                                                ((optional *)&mesh->skeleton);
                              if (!bVar1) {
                                it._M_node._7_1_ = 0;
                                nonstd::expected_lite::
                                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::expected<bool,_0>(__return_storage_ptr__,
                                                    (bool *)((long)&it._M_node + 7));
                                goto LAB_00480f75;
                              }
                              local_5a0 = nonstd::optional_lite::optional<tinyusdz::Relationship>::
                                          value(&mesh->skeleton);
                              Property::Property(&local_b80,local_5a0,false);
                              Property::operator=(out_prop,&local_b80);
                              Property::~Property(&local_b80);
                            }
                            else {
                              local_b90._M_node =
                                   (_Base_ptr)
                                   ::std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   ::find(&(mesh->super_GPrim).props,prop_name);
                              local_b98._M_node =
                                   (_Base_ptr)
                                   ::std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   ::end(&(mesh->super_GPrim).props);
                              bVar1 = ::std::operator==(&local_b90,&local_b98);
                              if (bVar1) {
                                local_b99 = false;
                                nonstd::expected_lite::
                                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::expected<bool,_0>(__return_storage_ptr__,&local_b99);
                                goto LAB_00480f75;
                              }
                              ppVar2 = ::std::
                                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                                       ::operator->(&local_b90);
                              Property::operator=(out_prop,&ppVar2->second);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_b9a = true;
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  expected<bool,_0>(__return_storage_ptr__,&local_b9a);
LAB_00480f75:
  local_b8 = 1;
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const GeomMesh &mesh, const std::string &prop_name, Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("points", mesh.points)
  TO_PROPERTY("faceVertexCounts", mesh.faceVertexCounts)
  TO_PROPERTY("faceVertexIndices", mesh.faceVertexCounts)
  TO_PROPERTY("normals", mesh.normals)
  TO_PROPERTY("velocities", mesh.velocities)
  TO_PROPERTY("cornerIndices", mesh.cornerIndices)
  TO_PROPERTY("cornerSharpnesses", mesh.cornerSharpnesses)
  TO_PROPERTY("creaseIndices", mesh.creaseIndices)
  TO_PROPERTY("creaseSharpnesses", mesh.creaseSharpnesses)
  TO_PROPERTY("holeIndices", mesh.holeIndices)
  TO_TOKEN_PROPERTY("interpolateBoundary", mesh.interpolateBoundary)
  TO_TOKEN_PROPERTY("subdivisionScheme", mesh.subdivisionScheme)
  TO_TOKEN_PROPERTY("faceVaryingLinearInterpolation",
                    mesh.faceVaryingLinearInterpolation)

  if (prop_name == "skeleton") {
    if (mesh.skeleton) {
      const Relationship &rel = mesh.skeleton.value();
      (*out_prop) = Property(rel, /* custom */ false);
    } else {
      // empty
      return false;
    }
  } else {
    const auto it = mesh.props.find(prop_name);
    if (it == mesh.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }

  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}